

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

bool_t ExprSkipAfter(tchar_t **p,wchar_t ch)

{
  char cVar1;
  bool_t bVar2;
  char *pcVar3;
  
  pcVar3 = *p;
  while( true ) {
    cVar1 = *pcVar3;
    if (cVar1 == '\0') {
      *p = pcVar3;
      return 0;
    }
    if (cVar1 == ch) break;
    if ((ch == L'\0') && (bVar2 = IsSpace((int)cVar1), bVar2 != 0)) {
      *p = pcVar3 + 1;
      goto LAB_00122df1;
    }
    pcVar3 = pcVar3 + 1;
  }
  *p = pcVar3 + 1;
  if (ch != L'\0') {
    return 1;
  }
LAB_00122df1:
  ExprSkipSpace(p);
  return 1;
}

Assistant:

NOINLINE bool_t ExprSkipAfter(const tchar_t** p,int ch)
{
    const tchar_t* s = *p;
    for (;*s;++s)
        if ((ch && *s == ch) || (!ch && IsSpace(*s)))
        {
            *p = s+1;
            if (!ch) ExprSkipSpace(p); // skip other spaces too
            return 1;
        }

    *p = s;
    return 0;
}